

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHessian_ASA_FSA.c
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  void *returnvalue;
  SUNContext ctx;
  SUNLinearSolver LSB2;
  SUNLinearSolver LSB1;
  SUNLinearSolver LS;
  SUNMatrix AB2;
  SUNMatrix AB1;
  SUNMatrix A;
  sunrealtype atolFD;
  sunrealtype rtolFD;
  sunrealtype H22;
  sunrealtype H11;
  sunrealtype grdG_cntr [2];
  sunrealtype grdG_bck [2];
  sunrealtype grdG_fwd [2];
  sunrealtype dp2;
  sunrealtype dp1;
  sunrealtype Gp;
  sunrealtype Gm;
  sunrealtype G;
  int is;
  int indexB2;
  int indexB1;
  int nckp;
  int retval;
  sunrealtype tf;
  sunrealtype ti;
  sunrealtype time;
  UserData data;
  void *ida_mem;
  N_Vector qB2;
  N_Vector ypB2;
  N_Vector yyB2;
  N_Vector qB1;
  N_Vector ypB1;
  N_Vector yyB1;
  N_Vector *qS;
  N_Vector *ypS;
  N_Vector *yyS;
  N_Vector q;
  N_Vector yp;
  N_Vector yy;
  int in_stack_fffffffffffffe9c;
  char *funcname;
  void *in_stack_fffffffffffffea8;
  int local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined1 local_a0 [4];
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 local_90;
  undefined1 local_88 [8];
  double *local_80;
  undefined8 local_78;
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  int local_4;
  
  local_4 = 0;
  funcname = (char *)0x0;
  SUNContext_Create(0,&stack0xfffffffffffffea0);
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("---------------------------------------------------------\n");
  printf("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0\n");
  printf("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0\n");
  printf("               y1  +  y2  +  y3 = 0\n\n");
  printf("Find dG/dp and d^2G/dp^2, where p=[p1,p2] for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");
  local_80 = (double *)malloc(0x18);
  *local_80 = 0.04;
  local_80[1] = 10000.0;
  local_80[2] = 30000000.0;
  local_18 = (long *)N_VNew_Serial(3,funcname);
  local_20 = (long *)N_VClone(local_18);
  **(undefined8 **)(*local_18 + 0x10) = 0x3ff0000000000000;
  *(undefined8 *)(*(long *)(*local_18 + 0x10) + 8) = 0;
  *(undefined8 *)(*(long *)(*local_18 + 0x10) + 0x10) = 0;
  **(undefined8 **)(*local_20 + 0x10) = 0xbfa47ae147ae147b;
  *(undefined8 *)(*(long *)(*local_20 + 0x10) + 8) = 0x3fa47ae147ae147b;
  *(undefined8 *)(*(long *)(*local_20 + 0x10) + 0x10) = 0;
  local_28 = (long *)N_VNew_Serial(1,funcname);
  N_VConst(local_28);
  local_30 = (undefined8 *)N_VCloneVectorArray(2,local_18);
  local_38 = (undefined8 *)N_VCloneVectorArray(2,local_20);
  N_VConst(*local_30);
  N_VConst(local_30[1]);
  N_VConst(*local_38);
  N_VConst(local_38[1]);
  local_40 = (undefined8 *)N_VCloneVectorArray(2,local_28);
  for (local_ac = 0; local_ac < 2; local_ac = local_ac + 1) {
    N_VConst(local_40[local_ac]);
  }
  local_78 = IDACreate(funcname);
  local_90 = 0;
  local_9c = IDAInit(0,local_78,res,local_18,local_20);
  local_9c = IDASStolerances(0x3e45798ee2308c3a,0x3ddb7cdfd9d7bdbb,local_78);
  uVar7 = SUNDenseMatrix(3,3,funcname);
  iVar6 = check_retval(in_stack_fffffffffffffea8,funcname,in_stack_fffffffffffffe9c);
  if (iVar6 == 0) {
    uVar8 = SUNLinSol_Dense(local_18,uVar7,funcname);
    iVar6 = check_retval(in_stack_fffffffffffffea8,funcname,in_stack_fffffffffffffe9c);
    if (iVar6 == 0) {
      local_9c = IDASetLinearSolver(local_78,uVar8,uVar7);
      iVar6 = check_retval(in_stack_fffffffffffffea8,funcname,in_stack_fffffffffffffe9c);
      if (iVar6 == 0) {
        local_9c = IDASetUserData(local_78,local_80);
        local_9c = IDASetMaxNumSteps(local_78,0x5dc);
        local_9c = IDAQuadInit(local_78,rhsQ,local_28);
        local_9c = IDAQuadSStolerances(0x3e45798ee2308c3a,0x3ddb7cdfd9d7bdbb,local_78);
        local_9c = IDASetQuadErrCon(local_78,1);
        local_9c = IDASensInit(local_78,2,1,resS,local_30,local_38);
        local_9c = IDASensEEtolerances(local_78);
        local_9c = IDASetSensErrCon(local_78,1);
        local_9c = IDAQuadSensInit(local_78,rhsQS,local_40);
        local_9c = IDAQuadSensEEtolerances(local_78);
        local_9c = IDASetQuadSensErrCon(local_78,1);
        local_9c = IDAAdjInit(local_78,100,1);
        printf("---------------------------------------------------------\n");
        printf("Forward integration\n");
        printf("---------------------------------------------------------\n\n");
        local_98 = 0x4054000000000000;
        local_9c = IDASolveF(0x4054000000000000,local_78,local_88,local_18,local_20,1,local_a0);
        IDAGetQuad(local_78,local_88,local_28);
        dVar1 = **(double **)(*local_28 + 0x10);
        printf("     G:    %12.4e\n",dVar1);
        IDAGetSensDky(local_98,local_78,0,local_30);
        IDAGetSensDky(local_98,local_78,1,local_38);
        IDAGetQuadSens(local_78,local_88,local_40);
        printf("   dG/dp:  %12.4e %12.4e\n",**(undefined8 **)(*(long *)*local_40 + 0x10),
               **(undefined8 **)(*(long *)local_40[1] + 0x10));
        printf("\n");
        local_48 = (long *)N_VNew_Serial(6,funcname);
        local_50 = (long *)N_VClone(local_48);
        N_VConst(local_48);
        *(undefined8 *)(*(long *)(*local_48 + 0x10) + 0x10) =
             *(undefined8 *)(*(long *)(*local_18 + 0x10) + 0x10);
        *(undefined8 *)(*(long *)(*local_48 + 0x10) + 0x28) =
             *(undefined8 *)(*(long *)(*(long *)*local_30 + 0x10) + 0x10);
        N_VConst(local_50);
        **(double **)(*local_50 + 0x10) =
             *(double *)(*(long *)(*local_18 + 0x10) + 0x10) - **(double **)(*local_18 + 0x10);
        *(double *)(*(long *)(*local_50 + 0x10) + 8) =
             *(double *)(*(long *)(*local_18 + 0x10) + 0x10) -
             *(double *)(*(long *)(*local_18 + 0x10) + 8);
        *(double *)(*(long *)(*local_50 + 0x10) + 0x18) =
             *(double *)(*(long *)(*(long *)*local_30 + 0x10) + 0x10) -
             **(double **)(*(long *)*local_30 + 0x10);
        *(double *)(*(long *)(*local_50 + 0x10) + 0x20) =
             *(double *)(*(long *)(*(long *)*local_30 + 0x10) + 0x10) -
             *(double *)(*(long *)(*(long *)*local_30 + 0x10) + 8);
        local_58 = (long *)N_VNew_Serial(4,funcname);
        N_VConst(local_58);
        local_9c = IDACreateB(local_78,&local_a4);
        local_9c = IDAInitBS(local_98,local_78,local_a4,resBS1,local_48,local_50);
        local_9c = IDASStolerancesB(local_78,local_a4);
        local_9c = IDASetUserDataB(local_78,local_a4,local_80);
        local_9c = IDASetMaxNumStepsB(local_78,local_a4,5000);
        uVar9 = SUNDenseMatrix(6,6,funcname);
        iVar6 = check_retval(in_stack_fffffffffffffea8,funcname,in_stack_fffffffffffffe9c);
        if (iVar6 == 0) {
          uVar10 = SUNLinSol_Dense(local_48,uVar9,funcname);
          iVar6 = check_retval(in_stack_fffffffffffffea8,funcname,in_stack_fffffffffffffe9c);
          if (iVar6 == 0) {
            local_9c = IDASetLinearSolverB(local_78,local_a4,uVar10,uVar9);
            iVar6 = check_retval(in_stack_fffffffffffffea8,funcname,in_stack_fffffffffffffe9c);
            if (iVar6 == 0) {
              local_9c = IDAQuadInitBS(local_78,local_a4,rhsQBS1,local_58);
              local_60 = (long *)N_VNew_Serial(6,funcname);
              local_68 = (long *)N_VNew_Serial(6,funcname);
              N_VConst(local_60);
              *(undefined8 *)(*(long *)(*local_60 + 0x10) + 0x10) =
                   *(undefined8 *)(*(long *)(*local_18 + 0x10) + 0x10);
              *(undefined8 *)(*(long *)(*local_60 + 0x10) + 0x28) =
                   *(undefined8 *)(*(long *)(*(long *)local_30[1] + 0x10) + 0x10);
              N_VConst(local_68);
              **(double **)(*local_68 + 0x10) =
                   *(double *)(*(long *)(*local_18 + 0x10) + 0x10) - **(double **)(*local_18 + 0x10)
              ;
              *(double *)(*(long *)(*local_68 + 0x10) + 8) =
                   *(double *)(*(long *)(*local_18 + 0x10) + 0x10) -
                   *(double *)(*(long *)(*local_18 + 0x10) + 8);
              *(double *)(*(long *)(*local_68 + 0x10) + 0x18) =
                   *(double *)(*(long *)(*(long *)local_30[1] + 0x10) + 0x10) -
                   **(double **)(*(long *)local_30[1] + 0x10);
              *(double *)(*(long *)(*local_68 + 0x10) + 0x20) =
                   *(double *)(*(long *)(*(long *)local_30[1] + 0x10) + 0x10) -
                   *(double *)(*(long *)(*(long *)local_30[1] + 0x10) + 8);
              local_70 = (long *)N_VNew_Serial(4,funcname);
              N_VConst(local_70);
              local_9c = IDACreateB(local_78,&local_a8);
              local_9c = IDAInitBS(local_98,local_78,local_a8,resBS2,local_60,local_68);
              local_9c = IDASStolerancesB(local_78,local_a8);
              local_9c = IDASetUserDataB(local_78,local_a8,local_80);
              local_9c = IDASetMaxNumStepsB(local_78,local_a8,0x9c4);
              uVar11 = SUNDenseMatrix(6,6,funcname);
              iVar6 = check_retval(in_stack_fffffffffffffea8,funcname,in_stack_fffffffffffffe9c);
              if (iVar6 == 0) {
                returnvalue = (void *)SUNLinSol_Dense(local_60,uVar11,funcname);
                iVar6 = check_retval(returnvalue,funcname,in_stack_fffffffffffffe9c);
                if (iVar6 == 0) {
                  local_9c = IDASetLinearSolverB(local_78,local_a8,returnvalue,uVar11);
                  iVar6 = check_retval(returnvalue,funcname,in_stack_fffffffffffffe9c);
                  if (iVar6 == 0) {
                    local_9c = IDAQuadInitBS(local_78,local_a8,rhsQBS2,local_70);
                    printf("---------------------------------------------------------\n");
                    printf("Backward integration \n");
                    printf("---------------------------------------------------------\n\n");
                    local_9c = IDASolveB(local_90,local_78,1);
                    local_9c = IDAGetB(local_78,local_a4,local_88,local_48,local_50);
                    local_9c = IDAGetQuadB(local_78,local_a4,local_88,local_58);
                    local_9c = IDAGetQuadB(local_78,local_a8,local_88,local_70);
                    printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n",
                           **(undefined8 **)(*local_58 + 0x10),
                           *(undefined8 *)(*(long *)(*local_58 + 0x10) + 8));
                    printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 2)\n",
                           **(undefined8 **)(*local_70 + 0x10),
                           *(undefined8 *)(*(long *)(*local_70 + 0x10) + 8));
                    printf("\n");
                    printf("   H = d2G/dp2:\n");
                    printf("        (1)            (2)\n");
                    printf("  %12.4e  %12.4e\n",*(undefined8 *)(*(long *)(*local_58 + 0x10) + 0x10),
                           *(undefined8 *)(*(long *)(*local_70 + 0x10) + 0x10));
                    printf("  %12.4e  %12.4e\n",*(undefined8 *)(*(long *)(*local_58 + 0x10) + 0x18),
                           *(undefined8 *)(*(long *)(*local_70 + 0x10) + 0x18));
                    IDAFree(&local_78);
                    SUNLinSolFree(uVar8);
                    SUNMatDestroy(uVar7);
                    SUNLinSolFree(uVar10);
                    SUNMatDestroy(uVar9);
                    SUNLinSolFree(returnvalue);
                    SUNMatDestroy(uVar11);
                    printf("\n");
                    printf("---------------------------------------------------------\n");
                    printf("Finite Differences ( dp1=%6.1e and dp2 = %6.1e )\n",0x3f50624dd2f1a9fc,
                           0x406f400000000000);
                    printf("---------------------------------------------------------\n\n");
                    local_78 = IDACreate(funcname);
                    *local_80 = *local_80 + 0.001;
                    **(undefined8 **)(*local_18 + 0x10) = 0x3ff0000000000000;
                    *(undefined8 *)(*(long *)(*local_18 + 0x10) + 8) = 0;
                    *(undefined8 *)(*(long *)(*local_18 + 0x10) + 0x10) = 0;
                    **(double **)(*local_20 + 0x10) = -*local_80;
                    *(ulong *)(*(long *)(*local_20 + 0x10) + 8) =
                         **(ulong **)(*local_20 + 0x10) ^ 0x8000000000000000;
                    *(undefined8 *)(*(long *)(*local_20 + 0x10) + 0x10) = 0;
                    N_VConst(local_28);
                    local_90 = 0;
                    local_98 = 0x4054000000000000;
                    local_9c = IDAInit(0,local_78,res,local_18,local_20);
                    local_9c = IDASStolerances(0x3d719799812dea11,0x3d06849b86a12b9b,local_78);
                    uVar7 = SUNDenseMatrix(3,3,funcname);
                    iVar6 = check_retval(returnvalue,funcname,in_stack_fffffffffffffe9c);
                    if (iVar6 == 0) {
                      uVar8 = SUNLinSol_Dense(local_18,uVar7,funcname);
                      iVar6 = check_retval(returnvalue,funcname,in_stack_fffffffffffffe9c);
                      if (iVar6 == 0) {
                        local_9c = IDASetLinearSolver(local_78,uVar8,uVar7);
                        iVar6 = check_retval(returnvalue,funcname,in_stack_fffffffffffffe9c);
                        if (iVar6 == 0) {
                          local_9c = IDASetUserData(local_78,local_80);
                          local_9c = IDASetMaxNumSteps(local_78,10000);
                          local_9c = IDAQuadInit(local_78,rhsQ,local_28);
                          local_9c = IDAQuadSStolerances(0x3d719799812dea11,0x3d06849b86a12b9b,
                                                         local_78);
                          local_9c = IDASetQuadErrCon(local_78,1);
                          local_9c = IDASolve(local_98,local_78,local_88,local_18,local_20,1);
                          local_9c = IDAGetQuad(local_78,local_88,local_28);
                          dVar2 = **(double **)(*local_28 + 0x10);
                          *local_80 = *local_80 - 0.002;
                          **(undefined8 **)(*local_18 + 0x10) = 0x3ff0000000000000;
                          *(undefined8 *)(*(long *)(*local_18 + 0x10) + 8) = 0;
                          *(undefined8 *)(*(long *)(*local_18 + 0x10) + 0x10) = 0;
                          **(double **)(*local_20 + 0x10) = -*local_80;
                          *(ulong *)(*(long *)(*local_20 + 0x10) + 8) =
                               **(ulong **)(*local_20 + 0x10) ^ 0x8000000000000000;
                          *(undefined8 *)(*(long *)(*local_20 + 0x10) + 0x10) = 0;
                          N_VConst(local_28);
                          local_9c = IDAReInit(local_90,local_78,local_18,local_20);
                          local_9c = IDAQuadReInit(local_78,local_28);
                          local_9c = IDASolve(local_98,local_78,local_88,local_18,local_20,1);
                          local_9c = IDAGetQuad(local_78,local_88,local_28);
                          dVar3 = **(double **)(*local_28 + 0x10);
                          *local_80 = *local_80 + 0.001;
                          local_80[1] = local_80[1] + 250.0;
                          **(undefined8 **)(*local_18 + 0x10) = 0x3ff0000000000000;
                          *(undefined8 *)(*(long *)(*local_18 + 0x10) + 8) = 0;
                          *(undefined8 *)(*(long *)(*local_18 + 0x10) + 0x10) = 0;
                          **(double **)(*local_20 + 0x10) = -*local_80;
                          *(ulong *)(*(long *)(*local_20 + 0x10) + 8) =
                               **(ulong **)(*local_20 + 0x10) ^ 0x8000000000000000;
                          *(undefined8 *)(*(long *)(*local_20 + 0x10) + 0x10) = 0;
                          N_VConst(local_28);
                          local_9c = IDAReInit(local_90,local_78,local_18,local_20);
                          local_9c = IDAQuadReInit(local_78,local_28);
                          local_9c = IDASolve(local_98,local_78,local_88,local_18,local_20,1);
                          local_9c = IDAGetQuad(local_78,local_88,local_28);
                          dVar4 = **(double **)(*local_28 + 0x10);
                          local_80[1] = local_80[1] - 500.0;
                          **(undefined8 **)(*local_18 + 0x10) = 0x3ff0000000000000;
                          *(undefined8 *)(*(long *)(*local_18 + 0x10) + 8) = 0;
                          *(undefined8 *)(*(long *)(*local_18 + 0x10) + 0x10) = 0;
                          **(double **)(*local_20 + 0x10) = -*local_80;
                          *(ulong *)(*(long *)(*local_20 + 0x10) + 8) =
                               **(ulong **)(*local_20 + 0x10) ^ 0x8000000000000000;
                          *(undefined8 *)(*(long *)(*local_20 + 0x10) + 0x10) = 0;
                          N_VConst(local_28);
                          local_9c = IDAReInit(local_90,local_78,local_18,local_20);
                          local_9c = IDAQuadReInit(local_78,local_28);
                          local_9c = IDASolve(local_98,local_78,local_88,local_18,local_20,1);
                          local_9c = IDAGetQuad(local_78,local_88,local_28);
                          dVar5 = **(double **)(*local_28 + 0x10);
                          printf("\n");
                          printf("   dG/dp:  %12.4e  %12.4e   (fwd FD)\n",(dVar2 - dVar1) / 0.001,
                                 (dVar4 - dVar1) / 250.0);
                          printf("           %12.4e  %12.4e   (bck FD)\n",(dVar1 - dVar3) / 0.001,
                                 (dVar1 - dVar5) / 250.0);
                          printf("           %12.4e  %12.4e   (cntr FD)\n",(dVar2 - dVar3) / 0.002,
                                 (dVar4 - dVar5) / 500.0);
                          printf("\n");
                          printf("  H(1,1):  %12.4e\n",((dVar2 - (dVar1 + dVar1)) + dVar3) / 1e-06);
                          printf("  H(2,2):  %12.4e\n",((dVar4 - (dVar1 + dVar1)) + dVar5) / 62500.0
                                );
                          IDAFree(&local_78);
                          SUNLinSolFree(uVar8);
                          SUNMatDestroy(uVar7);
                          N_VDestroy(local_48);
                          N_VDestroy(local_50);
                          N_VDestroy(local_58);
                          N_VDestroy(local_60);
                          N_VDestroy(local_68);
                          N_VDestroy(local_70);
                          N_VDestroy(local_18);
                          N_VDestroy(local_20);
                          N_VDestroy(local_28);
                          N_VDestroyVectorArray(local_30,2);
                          N_VDestroyVectorArray(local_38,2);
                          N_VDestroyVectorArray(local_40,2);
                          free(local_80);
                          SUNContext_Free(&stack0xfffffffffffffea0);
                          local_4 = 0;
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  N_Vector yy, yp, q, *yyS, *ypS, *qS;
  N_Vector yyB1, ypB1, qB1, yyB2, ypB2, qB2;
  void* ida_mem;
  UserData data;
  sunrealtype time, ti, tf;
  int retval, nckp, indexB1, indexB2, is;
  sunrealtype G, Gm, Gp, dp1, dp2, grdG_fwd[2], grdG_bck[2], grdG_cntr[2], H11,
    H22;
  sunrealtype rtolFD, atolFD;
  SUNMatrix A, AB1, AB2;
  SUNLinearSolver LS, LSB1, LSB2;

  /* Create the SUNDIALS context object for this simulation. */
  SUNContext ctx = NULL;
  SUNContext_Create(SUN_COMM_NULL, &ctx);

  /* Print problem description */
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("---------------------------------------------------------\n");
  printf("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0\n");
  printf("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0\n");
  printf("               y1  +  y2  +  y3 = 0\n\n");
  printf("Find dG/dp and d^2G/dp^2, where p=[p1,p2] for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");

  /* Allocate and initialize user data. */
  data       = (UserData)malloc(sizeof(*data));
  data->p[0] = P1;
  data->p[1] = P2;
  data->p[2] = P3;

  /* Consistent IC */
  yy         = N_VNew_Serial(NEQ, ctx);
  yp         = N_VClone(yy);
  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -P1;
  Ith(yp, 2) = P1;
  Ith(yp, 3) = 0;

  q = N_VNew_Serial(1, ctx);
  N_VConst(ZERO, q);

  yyS = N_VCloneVectorArray(NP, yy);
  ypS = N_VCloneVectorArray(NP, yp);
  N_VConst(ZERO, yyS[0]);
  N_VConst(ZERO, yyS[1]);
  N_VConst(ZERO, ypS[0]);
  N_VConst(ZERO, ypS[1]);

  qS = N_VCloneVectorArray(NP, q);
  for (is = 0; is < NP; is++) { N_VConst(ZERO, qS[is]); }

  ida_mem = IDACreate(ctx);

  ti     = T0;
  retval = IDAInit(ida_mem, res, ti, yy, yp);

  /* Forward problem's setup. */
  retval = IDASStolerances(ida_mem, RTOL, ATOL);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  retval = IDASetUserData(ida_mem, data);
  retval = IDASetMaxNumSteps(ida_mem, 1500);

  /* Quadrature's setup. */
  retval = IDAQuadInit(ida_mem, rhsQ, q);
  retval = IDAQuadSStolerances(ida_mem, RTOL, ATOL);
  retval = IDASetQuadErrCon(ida_mem, SUNTRUE);

  /* Sensitivity's setup. */
  retval = IDASensInit(ida_mem, NP, IDA_SIMULTANEOUS, resS, yyS, ypS);
  retval = IDASensEEtolerances(ida_mem);
  retval = IDASetSensErrCon(ida_mem, SUNTRUE);

  /* Setup of quadrature's sensitivities */
  retval = IDAQuadSensInit(ida_mem, rhsQS, qS);
  retval = IDAQuadSensEEtolerances(ida_mem);
  retval = IDASetQuadSensErrCon(ida_mem, SUNTRUE);

  /* Initialize ASA. */
  retval = IDAAdjInit(ida_mem, 100, IDA_HERMITE);

  printf("---------------------------------------------------------\n");
  printf("Forward integration\n");
  printf("---------------------------------------------------------\n\n");

  tf     = TF;
  retval = IDASolveF(ida_mem, tf, &time, yy, yp, IDA_NORMAL, &nckp);

  IDAGetQuad(ida_mem, &time, q);
  G = Ith(q, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("     G:    %12.4Le\n", G);
#else
  printf("     G:    %12.4e\n", G);
#endif

  /* Sensitivities are needed for IC of backward problems. */
  IDAGetSensDky(ida_mem, tf, 0, yyS);
  IDAGetSensDky(ida_mem, tf, 1, ypS);

  IDAGetQuadSens(ida_mem, &time, qS);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", Ith(qS[0], 1), Ith(qS[1], 1));
#else
  printf("   dG/dp:  %12.4e %12.4e\n", Ith(qS[0], 1), Ith(qS[1], 1));
#endif
  printf("\n");
  /******************************
  * BACKWARD PROBLEM #1
  *******************************/

  /* Consistent IC. */
  yyB1 = N_VNew_Serial(2 * NEQ, ctx);
  ypB1 = N_VClone(yyB1);

  N_VConst(ZERO, yyB1);
  Ith(yyB1, 3) = Ith(yy, 3);
  Ith(yyB1, 6) = Ith(yyS[0], 3);

  N_VConst(ZERO, ypB1);
  Ith(ypB1, 1) = Ith(yy, 3) - Ith(yy, 1);
  Ith(ypB1, 2) = Ith(yy, 3) - Ith(yy, 2);
  Ith(ypB1, 4) = Ith(yyS[0], 3) - Ith(yyS[0], 1);
  Ith(ypB1, 5) = Ith(yyS[0], 3) - Ith(yyS[0], 2);

  qB1 = N_VNew_Serial(2 * NP, ctx);
  N_VConst(ZERO, qB1);

  retval = IDACreateB(ida_mem, &indexB1);
  retval = IDAInitBS(ida_mem, indexB1, resBS1, tf, yyB1, ypB1);
  retval = IDASStolerancesB(ida_mem, indexB1, RTOLA, ATOLA);
  retval = IDASetUserDataB(ida_mem, indexB1, data);
  retval = IDASetMaxNumStepsB(ida_mem, indexB1, 5000);

  /* Create dense SUNMatrix for use in linear solves */
  AB1 = SUNDenseMatrix(2 * NEQ, 2 * NEQ, ctx);
  if (check_retval((void*)AB1, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB1 = SUNLinSol_Dense(yyB1, AB1, ctx);
  if (check_retval((void*)LSB1, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(ida_mem, indexB1, LSB1, AB1);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  retval = IDAQuadInitBS(ida_mem, indexB1, rhsQBS1, qB1);

  /******************************
  * BACKWARD PROBLEM #2
  *******************************/

  /* Consistent IC. */
  yyB2 = N_VNew_Serial(2 * NEQ, ctx);
  ypB2 = N_VNew_Serial(2 * NEQ, ctx);

  N_VConst(ZERO, yyB2);
  Ith(yyB2, 3) = Ith(yy, 3);
  Ith(yyB2, 6) = Ith(yyS[1], 3);

  N_VConst(ZERO, ypB2);
  Ith(ypB2, 1) = Ith(yy, 3) - Ith(yy, 1);
  Ith(ypB2, 2) = Ith(yy, 3) - Ith(yy, 2);
  Ith(ypB2, 4) = Ith(yyS[1], 3) - Ith(yyS[1], 1);
  Ith(ypB2, 5) = Ith(yyS[1], 3) - Ith(yyS[1], 2);

  qB2 = N_VNew_Serial(2 * NP, ctx);
  N_VConst(ZERO, qB2);

  retval = IDACreateB(ida_mem, &indexB2);
  retval = IDAInitBS(ida_mem, indexB2, resBS2, tf, yyB2, ypB2);
  retval = IDASStolerancesB(ida_mem, indexB2, RTOLA, ATOLA);
  retval = IDASetUserDataB(ida_mem, indexB2, data);
  retval = IDASetMaxNumStepsB(ida_mem, indexB2, 2500);

  /* Create dense SUNMatrix for use in linear solves */
  AB2 = SUNDenseMatrix(2 * NEQ, 2 * NEQ, ctx);
  if (check_retval((void*)AB2, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB2 = SUNLinSol_Dense(yyB2, AB2, ctx);
  if (check_retval((void*)LSB2, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(ida_mem, indexB2, LSB2, AB2);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  retval = IDAQuadInitBS(ida_mem, indexB2, rhsQBS2, qB2);

  /* Integrate backward problems. */
  printf("---------------------------------------------------------\n");
  printf("Backward integration \n");
  printf("---------------------------------------------------------\n\n");

  retval = IDASolveB(ida_mem, ti, IDA_NORMAL);

  retval = IDAGetB(ida_mem, indexB1, &time, yyB1, ypB1);
  /*
     retval = IDAGetNumSteps(IDAGetAdjIDABmem(ida_mem, indexB1), &nst);
     printf("at time=%g \tpb 1 Num steps:%d\n", time, nst);
     retval = IDAGetNumSteps(IDAGetAdjIDABmem(ida_mem, indexB2), &nst);
     printf("at time=%g \tpb 2 Num steps:%d\n\n", time, nst);
  */

  retval = IDAGetQuadB(ida_mem, indexB1, &time, qB1);
  retval = IDAGetQuadB(ida_mem, indexB2, &time, qB2);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le   (from backward pb. 1)\n", Ith(qB1, 1),
         Ith(qB1, 2));
  printf("   dG/dp:  %12.4Le %12.4Le   (from backward pb. 2)\n", Ith(qB2, 1),
         Ith(qB2, 2));
#else
  printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n", Ith(qB1, 1),
         Ith(qB1, 2));
  printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 2)\n", Ith(qB2, 1),
         Ith(qB2, 2));
#endif

  printf("\n");
  printf("   H = d2G/dp2:\n");
  printf("        (1)            (2)\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("  %12.4Le  %12.4Le\n", Ith(qB1, 3), Ith(qB2, 3));
  printf("  %12.4Le  %12.4Le\n", Ith(qB1, 4), Ith(qB2, 4));
#else
  printf("  %12.4e  %12.4e\n", Ith(qB1, 3), Ith(qB2, 3));
  printf("  %12.4e  %12.4e\n", Ith(qB1, 4), Ith(qB2, 4));
#endif

  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB1);
  SUNMatDestroy(AB1);
  SUNLinSolFree(LSB2);
  SUNMatDestroy(AB2);

  /*********************************
  * Use Finite Differences to verify
  **********************************/

  /* Perturbations are of different magnitudes as p1 and p2 are. */
  dp1 = SUN_RCONST(1.0e-3);
  dp2 = SUN_RCONST(2.5e+2);

  printf("\n");
  printf("---------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Finite Differences ( dp1=%6.1Le and dp2 = %6.1Le )\n", dp1, dp2);
#else
  printf("Finite Differences ( dp1=%6.1e and dp2 = %6.1e )\n", dp1, dp2);
#endif
  printf("---------------------------------------------------------\n\n");

  ida_mem = IDACreate(ctx);

  /********************
  * Forward FD for p1
  ********************/
  data->p[0] += dp1;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);
  ti = T0;
  tf = TF;

  retval = IDAInit(ida_mem, res, ti, yy, yp);

  rtolFD = SUN_RCONST(1.0e-12);
  atolFD = SUN_RCONST(1.0e-14);

  retval = IDASStolerances(ida_mem, rtolFD, atolFD);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  retval = IDASetUserData(ida_mem, data);
  retval = IDASetMaxNumSteps(ida_mem, 10000);

  retval = IDAQuadInit(ida_mem, rhsQ, q);
  retval = IDAQuadSStolerances(ida_mem, rtolFD, atolFD);
  retval = IDASetQuadErrCon(ida_mem, SUNTRUE);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gp     = Ith(q, 1);

  /********************
  * Backward FD for p1
  ********************/
  data->p[0] -= 2 * dp1;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);

  retval = IDAReInit(ida_mem, ti, yy, yp);
  retval = IDAQuadReInit(ida_mem, q);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gm     = Ith(q, 1);

  /* Compute FD for p1. */
  grdG_fwd[0]  = (Gp - G) / dp1;
  grdG_bck[0]  = (G - Gm) / dp1;
  grdG_cntr[0] = (Gp - Gm) / (2.0 * dp1);
  H11          = (Gp - 2.0 * G + Gm) / (dp1 * dp1);

  /********************
  * Forward FD for p2
  ********************/
  /*restore p1*/
  data->p[0] += dp1;
  data->p[1] += dp2;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);

  retval = IDAReInit(ida_mem, ti, yy, yp);
  retval = IDAQuadReInit(ida_mem, q);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gp     = Ith(q, 1);

  /********************
  * Backward FD for p2
  ********************/
  data->p[1] -= 2 * dp2;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);

  retval = IDAReInit(ida_mem, ti, yy, yp);
  retval = IDAQuadReInit(ida_mem, q);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gm     = Ith(q, 1);

  /* Compute FD for p2. */
  grdG_fwd[1]  = (Gp - G) / dp2;
  grdG_bck[1]  = (G - Gm) / dp2;
  grdG_cntr[1] = (Gp - Gm) / (2.0 * dp2);
  H22          = (Gp - 2.0 * G + Gm) / (dp2 * dp2);

  printf("\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le  %12.4Le   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4Le  %12.4Le   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4Le  %12.4Le   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4Le\n", H11);
  printf("  H(2,2):  %12.4Le\n", H22);
#else
  printf("   dG/dp:  %12.4e  %12.4e   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4e  %12.4e   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4e  %12.4e   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4e\n", H11);
  printf("  H(2,2):  %12.4e\n", H22);
#endif

  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  N_VDestroy(yyB1);
  N_VDestroy(ypB1);
  N_VDestroy(qB1);

  N_VDestroy(yyB2);
  N_VDestroy(ypB2);
  N_VDestroy(qB2);

  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);
  N_VDestroyVectorArray(yyS, NP);
  N_VDestroyVectorArray(ypS, NP);
  N_VDestroyVectorArray(qS, NP);

  free(data);

  SUNContext_Free(&ctx);
  return 0;
}